

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BufferSizeCase::testBuffer(BufferSizeCase *this)

{
  BufferParamVerifier *pBVar1;
  deUint32 dVar2;
  int iVar3;
  Random rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,0xabcdef);
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x8764,0
            );
  iVar3 = 0x10;
  do {
    dVar2 = deRandom_getUint32(&local_40);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferCase).super_ApiCase.super_CallLogWrapper,
               (this->super_BufferCase).m_bufferTarget,(ulong)(dVar2 % 0x401),(void *)0x0,0x88e0);
    ApiCase::expectError((ApiCase *)this,0);
    pBVar1 = (this->super_BufferCase).m_verifier;
    (*pBVar1->_vptr_BufferParamVerifier[2])
              (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x8764
               ,(ulong)(dVar2 % 0x401));
    ApiCase::expectError((ApiCase *)this,0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

void testBuffer (void)
	{
		const int numIteration = 16;
		de::Random rnd(0xabcdef);

		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_SIZE, 0);

		for (int i = 0; i < numIteration; ++i)
		{
			const GLint len = rnd.getInt(0, 1024);
			glBufferData(m_bufferTarget, len, DE_NULL, GL_STREAM_DRAW);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_SIZE, len);
			expectError(GL_NO_ERROR);
		}
	}